

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O2

void __thiscall
NetworkNS::cb3D_integrator::report
          (cb3D_integrator *this,uint istep,double b_energy,double nb_energy)

{
  Domain *pDVar1;
  clock_t cVar2;
  ostream *poVar3;
  double dVar4;
  double press_tens [6];
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  cVar2 = clock();
  calculate_pressure(this,&local_58);
  pDVar1 = this->cur_bd_net->domain;
  dVar4 = 1.0 / (pDVar1->XBoxLen * pDVar1->YBoxLen * pDVar1->ZBoxLen);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<double>(b_energy);
  std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<double>(nb_energy);
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<double>(local_58 * dVar4);
  std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<double>(local_50 * dVar4);
  std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<double>(local_48 * dVar4);
  std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<double>(local_40 * dVar4);
  std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<double>(local_38 * dVar4);
  std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<double>(dVar4 * local_30);
  poVar3 = std::operator<<(poVar3,"\t");
  std::operator<<(poVar3," # (");
  poVar3 = std::ostream::_M_insert<double>((double)(cVar2 - this->tbegin) / 1000000.0);
  poVar3 = std::operator<<(poVar3,"s )");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void cb3D_integrator::report(unsigned int istep, double b_energy, double nb_energy){

      double press_tens[6];

      // gvog: Ask for the current time:
      clock_t tend = clock();
      calculate_pressure(press_tens);

      double inv_vol = 1.0 / (  cur_bd_net->domain->XBoxLen
                              * cur_bd_net->domain->YBoxLen
                              * cur_bd_net->domain->ZBoxLen);
      
      cout << istep << "\t" << b_energy << "\t" << nb_energy << "\t"
              << cur_bd_net->network->pslip_springs.size() << "\t" 
              //<< pressure      * inv_vol << "\t" 
              << press_tens[0] * inv_vol << "\t"
              << press_tens[1] * inv_vol << "\t"
              << press_tens[2] * inv_vol << "\t"
              << press_tens[3] * inv_vol << "\t" 
              << press_tens[4] * inv_vol << "\t" 
              << press_tens[5] * inv_vol << "\t"
              << " # (" << (double) (tend - tbegin) / CLOCKS_PER_SEC << "s )" << endl;

      //cur_bd_net->my_traj_file->add_snapshot_to_dump(cur_bd_net, this, istep);

      return;
   }